

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O0

int Sbm_AddCardinConstrPairWise(sat_solver *p,Vec_Int_t *vVars,int K)

{
  Vec_Int_t *p_00;
  int *pVars;
  int local_20;
  int local_1c;
  int nVars;
  int K_local;
  Vec_Int_t *vVars_local;
  sat_solver *p_local;
  
  local_1c = K;
  _nVars = vVars;
  vVars_local = (Vec_Int_t *)p;
  local_20 = Vec_IntSize(vVars);
  p_00 = vVars_local;
  pVars = Vec_IntArray(_nVars);
  Sbm_AddCardinConstrRange((sat_solver *)p_00,pVars,0,local_20 + -1,&local_20);
  sat_solver_bookmark((sat_solver *)vVars_local);
  return local_20;
}

Assistant:

int Sbm_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K )
{
    int nVars = Vec_IntSize(vVars);
    Sbm_AddCardinConstrRange( p, Vec_IntArray(vVars), 0, nVars - 1, &nVars );
    sat_solver_bookmark( p );
    return nVars;
}